

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *from)

{
  Arena *arena_00;
  int iVar1;
  int iVar2;
  int iVar3;
  RepeatedPtrFieldBase **v1;
  RepeatedPtrFieldBase **v2;
  char *failure_msg;
  LogMessage *pLVar4;
  string **ppsVar5;
  int *piVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  string *this_00;
  Rep *pRVar8;
  Arena *arena;
  string **local_b0;
  string **end_assign;
  string **end;
  string **src;
  string **dst;
  int new_size;
  LogMessage local_80;
  Voidify local_69;
  RepeatedPtrFieldBase *local_68;
  RepeatedPtrFieldBase *local_60;
  Nullable<const_char_*> local_58;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  RepeatedPtrFieldBase *from_local;
  RepeatedPtrFieldBase *this_local;
  ulong local_38;
  size_t line;
  long local_28;
  void *prefetch_ptr;
  ptrdiff_t offset;
  RepeatedPtrFieldBase *local_10;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
    offset = local_38;
    prefetch_ptr = (void *)(local_38 * 0x40 + 0x40);
    local_28 = (long)from + (long)prefetch_ptr;
    local_10 = from;
  }
  local_60 = from;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from;
  from_local = this;
  this_local = from;
  line = (size_t)from;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::RepeatedPtrFieldBase_const*>(&local_60);
  local_68 = this;
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::RepeatedPtrFieldBase*>(&local_68);
  local_58 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::internal::RepeatedPtrFieldBase_const*,google::protobuf::internal::RepeatedPtrFieldBase*>
                       (v1,v2,"&from != this");
  if (local_58 == (Nullable<const_char_*>)0x0) {
    dst._0_4_ = this->current_size_ + *(int *)(absl_log_internal_check_op_result + 8);
    src = (string **)InternalReserve(this,(int)dst);
    ppsVar5 = (string **)elements((RepeatedPtrFieldBase *)absl_log_internal_check_op_result);
    end_assign = ppsVar5 + *(int *)(absl_log_internal_check_op_result + 8);
    end = ppsVar5;
    arena._4_4_ = ClearedCount(this);
    piVar6 = std::min<int>((int *)((long)&arena + 4),(int *)(absl_log_internal_check_op_result + 8))
    ;
    local_b0 = ppsVar5 + *piVar6;
    for (; end < local_b0; end = end + 1) {
      std::__cxx11::string::assign((string *)*src);
      src = src + 1;
    }
    arena_00 = this->arena_;
    if (arena_00 == (Arena *)0x0) {
      for (; end < end_assign; end = end + 1) {
        this_00 = (string *)operator_new(0x20);
        std::__cxx11::string::string((string *)this_00,(string *)*end);
        *src = this_00;
        src = src + 1;
      }
    }
    else {
      for (; end < end_assign; end = end + 1) {
        pbVar7 = Arena::Create<std::__cxx11::string,std::__cxx11::string&>(arena_00,*end);
        *src = pbVar7;
        src = src + 1;
      }
    }
    ExchangeCurrentSize(this,(int)dst);
    iVar1 = (int)dst;
    iVar3 = allocated_size(this);
    iVar2 = (int)dst;
    if (iVar3 < iVar1) {
      pRVar8 = rep(this);
      pRVar8->allocated_size = iVar2;
    }
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_58);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
             ,0x94,failure_msg);
  pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar4);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_80);
}

Assistant:

void RepeatedPtrFieldBase::MergeFrom<std::string>(
    const RepeatedPtrFieldBase& from) {
  Prefetch5LinesFrom1Line(&from);
  ABSL_DCHECK_NE(&from, this);
  int new_size = current_size_ + from.current_size_;
  auto dst = reinterpret_cast<std::string**>(InternalReserve(new_size));
  auto src = reinterpret_cast<std::string* const*>(from.elements());
  auto end = src + from.current_size_;
  auto end_assign = src + std::min(ClearedCount(), from.current_size_);
  for (; src < end_assign; ++dst, ++src) {
    (*dst)->assign(**src);
  }
  if (Arena* const arena = arena_) {
    for (; src < end; ++dst, ++src) {
      *dst = Arena::Create<std::string>(arena, **src);
    }
  } else {
    for (; src < end; ++dst, ++src) {
      *dst = new std::string(**src);
    }
  }
  ExchangeCurrentSize(new_size);
  if (new_size > allocated_size()) {
    rep()->allocated_size = new_size;
  }
}